

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_HTMLGeneration.cpp
# Opt level: O1

bool __thiscall
soul::HTMLGenerator::replaceTemplatePlaceholder
          (HTMLGenerator *this,CompileMessageList *errors,string *templateCode,string *placeholder,
          string *replacement)

{
  pointer pcVar1;
  string_view firstReplacement;
  size_type sVar2;
  _Alloc_hider _Var3;
  string_view firstToReplace;
  char *pcVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  CodeLocation local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_50 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  pcVar4 = (templateCode->_M_dataplus)._M_p;
  _Var3._M_p = (pointer)templateCode->_M_string_length;
  sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::find
                    ((basic_string_view<char,_std::char_traits<char>_> *)&stack0xffffffffffffff78,
                     (placeholder->_M_dataplus)._M_p,0,placeholder->_M_string_length);
  if (sVar2 == 0xffffffffffffffff) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &stack0xffffffffffffff78,"Template doesn\'t contain placeholder ",placeholder);
    local_68.sourceCode.object = (SourceCodeText *)0x0;
    local_68.location.data = (char *)0x0;
    CompileMessageList::addError(errors,(string *)&stack0xffffffffffffff78,&local_68);
    RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_68.sourceCode.object);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var3._M_p == &local_78) goto LAB_0024f254;
  }
  else {
    pcVar1 = (templateCode->_M_dataplus)._M_p;
    local_50[0] = &local_40;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_50,pcVar1,pcVar1 + templateCode->_M_string_length);
    firstReplacement._M_str = pcVar4;
    firstReplacement._M_len = (size_t)_Var3._M_p;
    firstToReplace._M_str = (char *)replacement->_M_string_length;
    firstToReplace._M_len = (size_t)(placeholder->_M_dataplus)._M_p;
    choc::text::replace<std::__cxx11::string>
              ((string *)&stack0xffffffffffffff78,(text *)local_50,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               placeholder->_M_string_length,firstToReplace,firstReplacement);
    std::__cxx11::string::operator=((string *)templateCode,(string *)&stack0xffffffffffffff78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var3._M_p != &local_78) {
      operator_delete(_Var3._M_p,local_78._M_allocated_capacity + 1);
    }
    local_78._M_allocated_capacity = local_40._M_allocated_capacity;
    _Var3._M_p = (pointer)local_50[0];
    if (local_50[0] == &local_40) goto LAB_0024f254;
  }
  operator_delete(_Var3._M_p,local_78._M_allocated_capacity + 1);
LAB_0024f254:
  return sVar2 != 0xffffffffffffffff;
}

Assistant:

bool replaceTemplatePlaceholder (soul::CompileMessageList& errors,
                                     std::string& templateCode,
                                     const std::string& placeholder,
                                     const std::string& replacement)
    {
        if (! choc::text::contains (templateCode, placeholder))
        {
            errors.addError ("Template doesn't contain placeholder " + placeholder, {});
            return false;
        }

        templateCode = choc::text::replace (templateCode, placeholder, replacement);
        return true;
    }